

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::Args(Args *this)

{
  long in_RDI;
  
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1939e0);
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  std::__cxx11::string::string((string *)(in_RDI + 0x58));
  std::__cxx11::string::string((string *)(in_RDI + 0xc0));
  std::__cxx11::string::string((string *)(in_RDI + 0xe8));
  std::__cxx11::string::string((string *)(in_RDI + 0x128));
  std::__cxx11::string::string((string *)(in_RDI + 0x148));
  std::__cxx11::string::string((string *)(in_RDI + 0x170));
  *(undefined8 *)(in_RDI + 0x78) = 0x3fa999999999999a;
  *(undefined4 *)(in_RDI + 0x84) = 100;
  *(undefined4 *)(in_RDI + 0x88) = 5;
  *(undefined4 *)(in_RDI + 0x8c) = 5;
  *(undefined4 *)(in_RDI + 0x90) = 5;
  *(undefined4 *)(in_RDI + 0x94) = 0;
  *(undefined4 *)(in_RDI + 0x98) = 5;
  *(undefined4 *)(in_RDI + 0x9c) = 1;
  *(undefined4 *)(in_RDI + 0xa0) = 2;
  *(undefined4 *)(in_RDI + 0xa4) = 2;
  *(undefined4 *)(in_RDI + 0xa8) = 2000000;
  *(undefined4 *)(in_RDI + 0xac) = 3;
  *(undefined4 *)(in_RDI + 0xb0) = 6;
  *(undefined4 *)(in_RDI + 0xb4) = 0xc;
  *(undefined4 *)(in_RDI + 0x80) = 100;
  *(undefined8 *)(in_RDI + 0xb8) = 0x3f1a36e2eb1c432d;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xc0),"__label__");
  *(undefined4 *)(in_RDI + 0xe0) = 2;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"");
  *(undefined1 *)(in_RDI + 0x108) = 0;
  *(undefined4 *)(in_RDI + 0x10c) = 0;
  *(undefined1 *)(in_RDI + 0x110) = 0;
  *(undefined1 *)(in_RDI + 0x111) = 0;
  *(undefined1 *)(in_RDI + 0x112) = 0;
  *(undefined8 *)(in_RDI + 0x118) = 0;
  *(undefined8 *)(in_RDI + 0x120) = 2;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x128),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x148),"f1");
  *(undefined4 *)(in_RDI + 0x168) = 1;
  *(undefined4 *)(in_RDI + 0x16c) = 300;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x170),"");
  return;
}

Assistant:

Args::Args() {
  lr = 0.05;
  dim = 100;
  ws = 5;
  epoch = 5;
  minCount = 5;
  minCountLabel = 0;
  neg = 5;
  wordNgrams = 1;
  loss = loss_name::ns;
  model = model_name::sg;
  bucket = 2000000;
  minn = 3;
  maxn = 6;
  thread = 12;
  lrUpdateRate = 100;
  t = 1e-4;
  label = "__label__";
  verbose = 2;
  pretrainedVectors = "";
  saveOutput = false;
  seed = 0;

  qout = false;
  retrain = false;
  qnorm = false;
  cutoff = 0;
  dsub = 2;

  autotuneValidationFile = "";
  autotuneMetric = "f1";
  autotunePredictions = 1;
  autotuneDuration = 60 * 5; // 5 minutes
  autotuneModelSize = "";
}